

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::local_date(sequence *__return_storage_ptr__,spec *s)

{
  character local_d8;
  character local_c8;
  repeat_exact local_b8;
  repeat_exact local_a0;
  repeat_exact local_88;
  digit local_70;
  digit local_58;
  digit local_40;
  
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_40.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004cc9a0;
  local_40.scanner_.from_ = '0';
  local_40.scanner_.to_ = '9';
  repeat_exact::repeat_exact<toml::detail::syntax::digit>(&local_88,4,&local_40);
  local_c8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
  local_c8.value_ = '-';
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_58.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004cc9a0;
  local_58.scanner_.from_ = '0';
  local_58.scanner_.to_ = '9';
  repeat_exact::repeat_exact<toml::detail::syntax::digit>(&local_a0,2,&local_58);
  local_d8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
  local_d8.value_ = '-';
  local_70.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_70.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004cc9a0;
  local_70.scanner_.from_ = '0';
  local_70.scanner_.to_ = '9';
  repeat_exact::repeat_exact<toml::detail::syntax::digit>(&local_b8,2,&local_70);
  sequence::
  sequence<toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (__return_storage_ptr__,&local_88,&local_c8,&local_a0,&local_d8,&local_b8);
  if ((_Head_base<0UL,_toml::detail::scanner_base_*,_false>)
      local_b8.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_b8.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  if (local_a0.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_a0.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  if (local_88.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_88.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence local_date(const spec& s)
{
    return sequence(
            repeat_exact(4, digit(s)),
            character('-'),
            repeat_exact(2, digit(s)),
            character('-'),
            repeat_exact(2, digit(s))
        );
}